

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
             int isCreate)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  Rtree *pRtree;
  sqlite3_str *psVar7;
  char *pcVar8;
  char *pcVar9;
  sqlite3_int64 sVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  i64 iVar14;
  sqlite3_uint64 n;
  int *piVar15;
  long lStackY_d0;
  char *local_a0;
  sqlite3_stmt *local_80;
  sqlite3_stmt **local_78 [9];
  
  if (0x67 < argc) {
    pcVar4 = sqlite3_mprintf("%s","Too many columns for an rtree table");
    *pzErr = pcVar4;
    return 1;
  }
  sqlite3_vtab_config(db,1);
  sVar5 = strlen(argv[1]);
  sVar6 = strlen(argv[2]);
  n = (long)(int)sVar6 + (long)(int)sVar5 + 0x3ca;
  pRtree = (Rtree *)sqlite3_malloc64(n);
  if (pRtree == (Rtree *)0x0) {
    return 7;
  }
  memset(pRtree,0,n);
  pRtree->nBusy = 1;
  (pRtree->base).pModule = &rtreeModule;
  pRtree->zDb = (char *)(pRtree + 1);
  pcVar4 = (char *)((long)&pRtree[1].base.pModule + ((long)((sVar5 << 0x20) + 0x100000000) >> 0x20))
  ;
  pRtree->zName = pcVar4;
  pRtree->eCoordType = pAux != (void *)0x0;
  memcpy(pRtree + 1,argv[1],(long)(int)sVar5);
  memcpy(pcVar4,argv[2],(long)(int)sVar6);
  psVar7 = sqlite3_str_new(db);
  sqlite3_str_appendf(psVar7,"CREATE TABLE x(%s",argv[3]);
  for (lVar13 = 4; lVar13 < argc; lVar13 = lVar13 + 1) {
    pcVar4 = argv[lVar13];
    if (*pcVar4 == '+') {
      pRtree->nAux = pRtree->nAux + '\x01';
      pcVar4 = pcVar4 + 1;
    }
    else {
      if (pRtree->nAux != '\0') break;
      pRtree->nDim2 = pRtree->nDim2 + '\x01';
    }
    sqlite3_str_appendf(psVar7,",%s",pcVar4);
  }
  sqlite3_str_appendf(psVar7,");");
  pcVar4 = sqlite3_str_finish(psVar7);
  if (pcVar4 == (char *)0x0) {
    iVar2 = 7;
  }
  else {
    if (lVar13 < argc) {
      pcVar8 = sqlite3_mprintf("%s","Auxiliary rtree columns must be last");
      iVar2 = 1;
    }
    else {
      iVar2 = sqlite3_declare_vtab(db,pcVar4);
      if (iVar2 == 0) {
        iVar2 = 0;
        goto LAB_001b0ba3;
      }
      pcVar8 = sqlite3_errmsg(db);
      pcVar8 = sqlite3_mprintf("%s",pcVar8);
    }
    *pzErr = pcVar8;
  }
LAB_001b0ba3:
  sqlite3_free(pcVar4);
  if (iVar2 != 0) goto LAB_001b0c70;
  bVar1 = pRtree->nDim2;
  pRtree->nDim = bVar1 >> 1;
  if (bVar1 < 2) {
    lStackY_d0 = 2;
LAB_001b0c4f:
    pcVar4 = *(char **)(&DAT_001fbb40 + lStackY_d0 * 8);
    iVar2 = 0;
  }
  else {
    if (10 < bVar1) {
      lStackY_d0 = 3;
      goto LAB_001b0c4f;
    }
    if ((bVar1 & 1) != 0) {
      lStackY_d0 = 1;
      goto LAB_001b0c4f;
    }
    pRtree->nBytesPerCell = bVar1 * '\x04' + '\b';
    if (isCreate == 0) {
      local_a0 = sqlite3_mprintf("SELECT length(data) FROM \'%q\'.\'%q_node\' WHERE nodeno = 1",
                                 pRtree->zDb,pRtree->zName);
      iVar2 = getIntFromStmt(db,local_a0,&pRtree->iNodeSize);
      if (iVar2 == 0) {
        if (pRtree->iNodeSize < 0x1c0) {
          pcVar4 = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",pRtree->zName);
          *pzErr = pcVar4;
          iVar2 = 0x10b;
        }
        else {
          iVar2 = 0;
        }
      }
      else {
        pcVar4 = sqlite3_errmsg(db);
        pcVar4 = sqlite3_mprintf("%s",pcVar4);
        *pzErr = pcVar4;
      }
    }
    else {
      local_78[0] = (sqlite3_stmt **)((ulong)local_78[0] & 0xffffffff00000000);
      local_a0 = sqlite3_mprintf("PRAGMA %Q.page_size",pRtree->zDb);
      iVar2 = getIntFromStmt(db,local_a0,(int *)local_78);
      if (iVar2 == 0) {
        iVar3 = (uint)pRtree->nBytesPerCell * 0x33 + 4;
        if ((int)local_78[0] + -0x40 <= iVar3) {
          iVar3 = (int)local_78[0] + -0x40;
        }
        pRtree->iNodeSize = iVar3;
      }
      else {
        pcVar4 = sqlite3_errmsg(db);
        pcVar4 = sqlite3_mprintf("%s",pcVar4);
        *pzErr = pcVar4;
      }
    }
    sqlite3_free(local_a0);
    if (iVar2 != 0) goto LAB_001b0c70;
    pcVar4 = argv[1];
    pcVar8 = argv[2];
    pRtree->db = db;
    if (isCreate == 0) {
LAB_001b0e53:
      local_78[0] = &pRtree->pWriteNode;
      local_78[1] = &pRtree->pDeleteNode;
      local_78[2] = &pRtree->pReadRowid;
      local_78[3] = &pRtree->pWriteRowid;
      local_78[4] = &pRtree->pDeleteRowid;
      local_78[5] = &pRtree->pReadParent;
      local_78[6] = &pRtree->pWriteParent;
      local_78[7] = &pRtree->pDeleteParent;
      iVar3 = sqlite3_table_column_metadata
                        (db,pRtree->zDb,"sqlite_stat1",(char *)0x0,(char **)0x0,(char **)0x0,
                         (int *)0x0,(int *)0x0,(int *)0x0);
      if (iVar3 == 0) {
        pcVar9 = sqlite3_mprintf("SELECT stat FROM %Q.sqlite_stat1 WHERE tbl = \'%q_rowid\'",
                                 pRtree->zDb,pRtree->zName);
        if (pcVar9 == (char *)0x0) {
          iVar2 = 7;
        }
        else {
          iVar2 = sqlite3_prepare_v2(db,pcVar9,-1,&local_80,(char **)0x0);
          if (iVar2 != 7) {
            iVar14 = 0x100000;
            if (iVar2 == 0) {
              iVar2 = sqlite3_step(local_80);
              if (iVar2 == 100) {
                sVar10 = sqlite3_column_int64(local_80,0);
              }
              else {
                sVar10 = 0;
              }
              iVar2 = sqlite3_finalize(local_80);
              if (iVar2 != 0) goto LAB_001b0fa1;
              if ((sVar10 != 0) && (iVar14 = 100, 100 < sVar10)) {
                iVar14 = sVar10;
              }
            }
            pRtree->nRowEst = iVar14;
            iVar2 = 0;
          }
LAB_001b0fa1:
          sqlite3_free(pcVar9);
        }
      }
      else {
        pRtree->nRowEst = 0x100000;
        iVar2 = 0;
        if (iVar3 != 1) {
          iVar2 = iVar3;
        }
      }
      piVar15 = &rtreeSqlInit_azSql_rel;
      uVar12 = 0;
      while ((uVar12 < 8 && (iVar2 == 0))) {
        if ((uVar12 != 3) ||
           (pcVar9 = 
            "INSERT INTO\"%w\".\"%w_rowid\"(rowid,nodeno)VALUES(?1,?2)ON CONFLICT(rowid)DO UPDATE SET nodeno=excluded.nodeno"
           , pRtree->nAux == '\0')) {
          pcVar9 = (char *)((long)&rtreeSqlInit_azSql_rel + (long)*piVar15);
        }
        pcVar9 = sqlite3_mprintf(pcVar9,pcVar4,pcVar8);
        iVar2 = 7;
        if (pcVar9 != (char *)0x0) {
          iVar2 = sqlite3_prepare_v3(db,pcVar9,-1,5,local_78[uVar12],(char **)0x0);
        }
        sqlite3_free(pcVar9);
        uVar12 = uVar12 + 1;
        piVar15 = piVar15 + 1;
      }
      if (pRtree->nAux == '\0') {
LAB_001b113c:
        if (iVar2 == 0) {
          *ppVtab = (sqlite3_vtab *)pRtree;
          return 0;
        }
      }
      else {
        pcVar9 = sqlite3_mprintf("SELECT * FROM \"%w\".\"%w_rowid\" WHERE rowid=?1",pcVar4,pcVar8);
        pRtree->zReadAuxSql = pcVar9;
        iVar2 = 7;
        if (pcVar9 != (char *)0x0) {
          psVar7 = sqlite3_str_new(db);
          sqlite3_str_appendf(psVar7,"UPDATE \"%w\".\"%w_rowid\"SET ",pcVar4,pcVar8);
          for (uVar11 = 0; uVar11 < pRtree->nAux; uVar11 = uVar11 + 1) {
            if (uVar11 != 0) {
              sqlite3_str_append(psVar7,",",1);
            }
            if (uVar11 < pRtree->nAuxNotNull) {
              sqlite3_str_appendf(psVar7,"a%d=coalesce(?%d,a%d)",(ulong)uVar11,(ulong)(uVar11 + 2),
                                  (ulong)uVar11);
            }
            else {
              sqlite3_str_appendf(psVar7,"a%d=?%d",(ulong)uVar11,(ulong)(uVar11 + 2));
            }
          }
          sqlite3_str_appendf(psVar7," WHERE rowid=?1");
          pcVar4 = sqlite3_str_finish(psVar7);
          iVar2 = 7;
          if (pcVar4 != (char *)0x0) {
            iVar2 = sqlite3_prepare_v3(db,pcVar4,-1,5,&pRtree->pWriteAux,(char **)0x0);
            sqlite3_free(pcVar4);
            goto LAB_001b113c;
          }
        }
      }
    }
    else {
      psVar7 = sqlite3_str_new(db);
      sqlite3_str_appendf(psVar7,"CREATE TABLE \"%w\".\"%w_rowid\"(rowid INTEGER PRIMARY KEY,nodeno"
                          ,pcVar4,pcVar8);
      for (uVar11 = 0; uVar11 < pRtree->nAux; uVar11 = uVar11 + 1) {
        sqlite3_str_appendf(psVar7,",a%d",(ulong)uVar11);
      }
      sqlite3_str_appendf(psVar7,
                          ");CREATE TABLE \"%w\".\"%w_node\"(nodeno INTEGER PRIMARY KEY,data);",
                          pcVar4,pcVar8);
      sqlite3_str_appendf(psVar7,
                          "CREATE TABLE \"%w\".\"%w_parent\"(nodeno INTEGER PRIMARY KEY,parentnode);"
                          ,pcVar4,pcVar8);
      sqlite3_str_appendf(psVar7,"INSERT INTO \"%w\".\"%w_node\"VALUES(1,zeroblob(%d))",pcVar4);
      pcVar9 = sqlite3_str_finish(psVar7);
      if (pcVar9 == (char *)0x0) {
        iVar2 = 7;
      }
      else {
        iVar2 = sqlite3_exec(db,pcVar9,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
        sqlite3_free(pcVar9);
        if (iVar2 == 0) goto LAB_001b0e53;
      }
    }
    pcVar4 = sqlite3_errmsg(db);
  }
  pcVar4 = sqlite3_mprintf("%s",pcVar4);
  *pzErr = pcVar4;
LAB_001b0c70:
  rtreeRelease(pRtree);
  return iVar2 + (uint)(iVar2 == 0);
}

Assistant:

static int rtreeInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  int nDb;              /* Length of string argv[1] */
  int nName;            /* Length of string argv[2] */
  int eCoordType = (pAux ? RTREE_COORD_INT32 : RTREE_COORD_REAL32);
  sqlite3_str *pSql;
  char *zSql;
  int ii = 4;
  int iErr;

  const char *aErrMsg[] = {
    0,                                                    /* 0 */
    "Wrong number of columns for an rtree table",         /* 1 */
    "Too few columns for an rtree table",                 /* 2 */
    "Too many columns for an rtree table",                /* 3 */
    "Auxiliary rtree columns must be last"                /* 4 */
  };

  assert( RTREE_MAX_AUX_COLUMN<256 ); /* Aux columns counted by a u8 */
  if( argc>RTREE_MAX_AUX_COLUMN+3 ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[3]);
    return SQLITE_ERROR;
  }

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);

  /* Allocate the sqlite3_vtab structure */
  nDb = (int)strlen(argv[1]);
  nName = (int)strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName+2);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName+2);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->eCoordType = (u8)eCoordType;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(%s", argv[3]);
  for(ii=4; ii<argc; ii++){
    if( argv[ii][0]=='+' ){
      pRtree->nAux++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]+1);
    }else if( pRtree->nAux>0 ){
      break;
    }else{
      pRtree->nDim2++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]);
    }
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( ii<argc ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[4]);
    rc = SQLITE_ERROR;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto rtreeInit_fail;
  pRtree->nDim = pRtree->nDim2/2;
  if( pRtree->nDim<1 ){
    iErr = 2;
  }else if( pRtree->nDim2>RTREE_MAX_DIMENSIONS*2 ){
    iErr = 3;
  }else if( pRtree->nDim2 % 2 ){
    iErr = 1;
  }else{
    iErr = 0;
  }
  if( iErr ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[iErr]);
    goto rtreeInit_fail;
  }
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto rtreeInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto rtreeInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

rtreeInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}